

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zpanel_bmod.c
# Opt level: O2

void zpanel_bmod(int m,int w,int jcol,int nseg,doublecomplex *dense,doublecomplex *tempv,int *segrep
                ,int *repfnz,GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  int *piVar1;
  long lVar2;
  undefined8 *puVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  flops_t *pfVar15;
  int *piVar16;
  int *piVar17;
  int_t *piVar18;
  int_t *piVar19;
  void *pvVar20;
  int_t *piVar21;
  doublecomplex dVar22;
  doublecomplex dVar23;
  doublecomplex dVar24;
  doublecomplex dVar25;
  doublecomplex dVar26;
  doublecomplex dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  int *piVar40;
  doublecomplex *pdVar41;
  doublecomplex *pdVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  long lVar47;
  double *pdVar48;
  long lVar49;
  double *pdVar50;
  int *piVar51;
  doublecomplex *pdVar52;
  int ldm;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  int iVar56;
  long lVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  ulong uVar61;
  long lVar62;
  uint nrow;
  int iVar63;
  ulong uVar64;
  int iVar65;
  long lVar66;
  long lVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  doublecomplex *local_138;
  
  pfVar15 = stat->ops;
  piVar16 = Glu->xsup;
  piVar17 = Glu->supno;
  piVar18 = Glu->lsub;
  piVar19 = Glu->xlsub;
  pvVar20 = Glu->lusup;
  piVar21 = Glu->xlusup;
  iVar32 = sp_ienv(3);
  iVar33 = sp_ienv(7);
  iVar33 = sp_ienv((uint)(iVar32 <= iVar33) * 4 + 3);
  iVar34 = sp_ienv(4);
  iVar35 = sp_ienv(5);
  iVar36 = iVar33 + iVar34;
  iVar63 = w + jcol;
  lVar47 = (long)nseg;
  iVar56 = 0;
  iVar32 = 0;
  if (0 < nseg) {
    iVar32 = nseg;
  }
  lVar2 = (long)pvVar20 + 0x18;
  for (; iVar56 != iVar32; iVar56 = iVar56 + 1) {
    lVar47 = lVar47 + -1;
    iVar11 = segrep[lVar47];
    iVar12 = piVar16[piVar17[iVar11]];
    iVar65 = iVar11 - iVar12;
    iVar58 = iVar65 + 1;
    iVar13 = piVar19[iVar12];
    ldm = piVar19[(long)iVar12 + 1] - iVar13;
    nrow = ldm - iVar58;
    iVar60 = iVar13 + iVar65 + 1;
    iVar43 = ldm + 1;
    lVar67 = (long)(iVar13 + iVar65);
    iVar37 = ldm * iVar65 + iVar65 + 1;
    lVar66 = (long)ldm;
    if ((iVar58 < iVar35) || ((int)nrow <= iVar34)) {
      lVar38 = (long)iVar60;
      uVar64 = 0;
      if (0 < (int)nrow) {
        uVar64 = (ulong)nrow;
      }
      piVar51 = repfnz;
      pdVar42 = dense;
      for (iVar60 = jcol; iVar60 < iVar63; iVar60 = iVar60 + 1) {
        iVar58 = piVar51[iVar11];
        if (iVar58 != -1) {
          uVar53 = (iVar11 - iVar58) + 1;
          iVar59 = piVar21[iVar12];
          pfVar15[0x13] = (float)(int)((iVar11 - iVar58) * uVar53 * 4) + pfVar15[0x13];
          pfVar15[0x14] = (float)(int)(nrow * 8 * uVar53) + pfVar15[0x14];
          uVar54 = iVar11 - iVar58;
          if (uVar54 == 0) {
            dVar28 = pdVar42[piVar18[lVar67]].r;
            dVar29 = pdVar42[piVar18[lVar67]].i;
            iVar58 = piVar19[(long)iVar12 + 1];
            pdVar48 = (double *)((long)pvVar20 + (long)(iVar59 + iVar37) * 0x10 + 8);
            for (lVar57 = lVar38; lVar57 < iVar58; lVar57 = lVar57 + 1) {
              iVar59 = piVar18[lVar57];
              dVar68 = pdVar48[-1];
              dVar69 = *pdVar48;
              dVar4 = pdVar42[iVar59].i;
              pdVar42[iVar59].r = pdVar42[iVar59].r - (dVar68 * dVar28 + dVar69 * -dVar29);
              pdVar42[iVar59].i = dVar4 - (dVar68 * dVar29 + dVar69 * dVar28);
              pdVar48 = pdVar48 + 2;
            }
          }
          else if ((int)uVar54 < 3) {
            iVar59 = iVar59 + iVar65 * iVar43;
            iVar58 = piVar18[lVar67 + -1];
            dVar28 = pdVar42[piVar18[lVar67]].r;
            dVar29 = pdVar42[piVar18[lVar67]].i;
            dVar68 = pdVar42[iVar58].r;
            dVar69 = pdVar42[iVar58].i;
            iVar46 = iVar59 - ldm;
            if (uVar53 == 2) {
              lVar49 = (long)iVar46 * 0x10;
              dVar4 = *(double *)((long)pvVar20 + lVar49 + 8);
              dVar28 = dVar28 - (*(double *)((long)pvVar20 + lVar49) * dVar68 + dVar4 * -dVar69);
              dVar29 = dVar29 - (*(double *)((long)pvVar20 + lVar49) * dVar69 + dVar4 * dVar68);
              dVar25.i._0_4_ = SUB84(dVar29,0);
              dVar25.r = dVar28;
              dVar25.i._4_4_ = (int)((ulong)dVar29 >> 0x20);
              pdVar42[piVar18[lVar67]] = dVar25;
              iVar58 = piVar19[(long)iVar12 + 1];
              lVar39 = (long)iVar59 * 0x10;
              lVar57 = lVar2;
              for (lVar62 = lVar38; lVar62 < iVar58; lVar62 = lVar62 + 1) {
                iVar59 = piVar18[lVar62];
                dVar4 = *(double *)(lVar57 + -8 + lVar39);
                dVar5 = *(double *)(lVar57 + lVar39);
                dVar6 = *(double *)(lVar57 + -8 + lVar49);
                dVar7 = *(double *)(lVar57 + lVar49);
                dVar30 = pdVar42[iVar59].i;
                pdVar42[iVar59].r =
                     pdVar42[iVar59].r -
                     (dVar6 * dVar68 + dVar7 * -dVar69 + dVar4 * dVar28 + dVar5 * -dVar29);
                pdVar42[iVar59].i =
                     dVar30 - (dVar6 * dVar69 + dVar7 * dVar68 + dVar4 * dVar29 + dVar5 * dVar28);
                lVar57 = lVar57 + 0x10;
              }
            }
            else {
              lVar62 = (long)(iVar46 - ldm) * 0x10;
              dVar7 = pdVar42[piVar18[lVar67 + -2]].r;
              dVar30 = pdVar42[piVar18[lVar67 + -2]].i;
              dVar70 = -dVar30;
              dVar4 = *(double *)((long)pvVar20 + lVar62 + -0x10);
              dVar5 = *(double *)((long)pvVar20 + lVar62 + -8);
              dVar6 = *(double *)((long)pvVar20 + lVar62 + 8);
              dVar68 = dVar68 - (dVar4 * dVar7 + dVar5 * dVar70);
              dVar69 = dVar69 - (dVar4 * dVar30 + dVar5 * dVar7);
              lVar57 = (long)iVar46 * 0x10;
              dVar4 = *(double *)((long)pvVar20 + lVar57 + 8);
              dVar28 = dVar28 - (*(double *)((long)pvVar20 + lVar62) * dVar7 + dVar6 * dVar70 +
                                *(double *)((long)pvVar20 + lVar57) * dVar68 + dVar4 * -dVar69);
              dVar29 = dVar29 - (*(double *)((long)pvVar20 + lVar62) * dVar30 + dVar6 * dVar7 +
                                *(double *)((long)pvVar20 + lVar57) * dVar69 + dVar4 * dVar68);
              dVar26.i._0_4_ = SUB84(dVar29,0);
              dVar26.r = dVar28;
              dVar26.i._4_4_ = (int)((ulong)dVar29 >> 0x20);
              pdVar42[piVar18[lVar67]] = dVar26;
              pdVar42[iVar58].r = dVar68;
              pdVar42[iVar58].i = dVar69;
              iVar58 = piVar19[(long)iVar12 + 1];
              pdVar48 = (double *)((long)iVar59 * 0x10 + lVar2);
              pdVar50 = (double *)(lVar57 + lVar2);
              for (lVar57 = lVar38; lVar57 < iVar58; lVar57 = lVar57 + 1) {
                iVar59 = piVar18[lVar57];
                dVar4 = pdVar48[-1];
                dVar5 = *pdVar48;
                dVar6 = pdVar50[-1];
                dVar8 = *pdVar50;
                dVar9 = pdVar50[lVar66 * -2 + -1];
                dVar10 = pdVar50[lVar66 * -2];
                dVar31 = pdVar42[iVar59].i;
                pdVar42[iVar59].r =
                     pdVar42[iVar59].r -
                     (dVar9 * dVar7 + dVar10 * dVar70 +
                     dVar6 * dVar68 + dVar8 * -dVar69 + dVar4 * dVar28 + dVar5 * -dVar29);
                pdVar42[iVar59].i =
                     dVar31 - (dVar9 * dVar30 + dVar10 * dVar7 +
                              dVar6 * dVar69 + dVar8 * dVar68 + dVar4 * dVar29 + dVar5 * dVar28);
                pdVar48 = pdVar48 + 2;
                pdVar50 = pdVar50 + 2;
              }
            }
          }
          else {
            piVar1 = piVar18 + (iVar13 + (iVar58 - iVar12));
            pdVar52 = tempv;
            for (uVar61 = 0; uVar61 <= uVar54; uVar61 = uVar61 + 1) {
              dVar28 = pdVar42[piVar1[uVar61]].i;
              pdVar52->r = pdVar42[piVar1[uVar61]].r;
              pdVar52->i = dVar28;
              pdVar52 = pdVar52 + 1;
            }
            iVar59 = iVar59 + (iVar58 - iVar12) * iVar43;
            zlsolve(ldm,uVar53,(doublecomplex *)((long)iVar59 * 0x10 + (long)pvVar20),tempv);
            pdVar41 = tempv + uVar53;
            zmatvec(ldm,nrow,uVar53,
                    (doublecomplex *)((long)(int)(iVar59 + uVar53) * 0x10 + (long)pvVar20),tempv,
                    pdVar41);
            piVar40 = piVar1;
            pdVar52 = tempv;
            for (uVar61 = 0; uVar61 <= uVar54; uVar61 = uVar61 + 1) {
              iVar58 = piVar1[uVar61];
              dVar28 = pdVar52->i;
              pdVar42[iVar58].r = pdVar52->r;
              pdVar42[iVar58].i = dVar28;
              pdVar52->r = 0.0;
              pdVar52->i = 0.0;
              pdVar52 = pdVar52 + 1;
              piVar40 = piVar40 + 1;
            }
            for (lVar57 = 0; uVar64 << 4 != lVar57; lVar57 = lVar57 + 0x10) {
              pdVar48 = (double *)((long)&pdVar41->r + lVar57);
              dVar28 = pdVar42[*piVar40].i - pdVar48[1];
              dVar27.i._0_4_ = SUB84(dVar28,0);
              dVar27.r = pdVar42[*piVar40].r - *pdVar48;
              dVar27.i._4_4_ = (int)((ulong)dVar28 >> 0x20);
              pdVar42[*piVar40] = dVar27;
              puVar3 = (undefined8 *)((long)&pdVar41->r + lVar57);
              *puVar3 = 0;
              puVar3[1] = 0;
              piVar40 = piVar40 + 1;
            }
          }
        }
        piVar51 = piVar51 + m;
        pdVar42 = pdVar42 + m;
      }
    }
    else {
      lVar38 = (long)iVar60;
      piVar51 = repfnz;
      pdVar42 = dense;
      local_138 = tempv;
      for (iVar59 = jcol; iVar59 < iVar63; iVar59 = iVar59 + 1) {
        iVar46 = piVar51[iVar11];
        if (iVar46 != -1) {
          iVar14 = (iVar11 - iVar46) + 1;
          iVar44 = piVar21[iVar12];
          pfVar15[0x13] = (float)((iVar11 - iVar46) * iVar14 * 4) + pfVar15[0x13];
          pfVar15[0x14] = (float)(int)(nrow * 8 * iVar14) + pfVar15[0x14];
          uVar53 = iVar11 - iVar46;
          if (uVar53 == 0) {
            dVar28 = pdVar42[piVar18[lVar67]].r;
            dVar29 = pdVar42[piVar18[lVar67]].i;
            iVar46 = piVar19[(long)iVar12 + 1];
            pdVar48 = (double *)((long)pvVar20 + (long)(iVar44 + iVar37) * 0x10 + 8);
            for (lVar57 = lVar38; lVar57 < iVar46; lVar57 = lVar57 + 1) {
              iVar14 = piVar18[lVar57];
              dVar68 = pdVar48[-1];
              dVar69 = *pdVar48;
              dVar4 = pdVar42[iVar14].i;
              pdVar42[iVar14].r = pdVar42[iVar14].r - (dVar68 * dVar28 + dVar69 * -dVar29);
              pdVar42[iVar14].i = dVar4 - (dVar68 * dVar29 + dVar69 * dVar28);
              pdVar48 = pdVar48 + 2;
            }
          }
          else if ((int)uVar53 < 3) {
            iVar46 = piVar18[lVar67 + -1];
            dVar28 = pdVar42[piVar18[lVar67]].r;
            dVar29 = pdVar42[piVar18[lVar67]].i;
            dVar68 = pdVar42[iVar46].r;
            dVar69 = pdVar42[iVar46].i;
            iVar44 = iVar44 + iVar65 * iVar43;
            iVar45 = iVar44 - ldm;
            if (iVar14 == 2) {
              lVar49 = (long)iVar45 * 0x10;
              dVar4 = *(double *)((long)pvVar20 + lVar49 + 8);
              dVar28 = dVar28 - (*(double *)((long)pvVar20 + lVar49) * dVar68 + dVar4 * -dVar69);
              dVar29 = dVar29 - (*(double *)((long)pvVar20 + lVar49) * dVar69 + dVar4 * dVar68);
              dVar22.i._0_4_ = SUB84(dVar29,0);
              dVar22.r = dVar28;
              dVar22.i._4_4_ = (int)((ulong)dVar29 >> 0x20);
              pdVar42[piVar18[lVar67]] = dVar22;
              iVar46 = piVar19[(long)iVar12 + 1];
              lVar39 = (long)iVar44 * 0x10;
              lVar57 = lVar2;
              for (lVar62 = lVar38; lVar62 < iVar46; lVar62 = lVar62 + 1) {
                iVar14 = piVar18[lVar62];
                dVar4 = *(double *)(lVar57 + -8 + lVar39);
                dVar5 = *(double *)(lVar57 + lVar39);
                dVar6 = *(double *)(lVar57 + -8 + lVar49);
                dVar7 = *(double *)(lVar57 + lVar49);
                dVar30 = pdVar42[iVar14].i;
                pdVar42[iVar14].r =
                     pdVar42[iVar14].r -
                     (dVar6 * dVar68 + dVar7 * -dVar69 + dVar4 * dVar28 + dVar5 * -dVar29);
                pdVar42[iVar14].i =
                     dVar30 - (dVar6 * dVar69 + dVar7 * dVar68 + dVar4 * dVar29 + dVar5 * dVar28);
                lVar57 = lVar57 + 0x10;
              }
            }
            else {
              lVar62 = (long)(iVar45 - ldm) * 0x10;
              dVar7 = pdVar42[piVar18[lVar67 + -2]].r;
              dVar30 = pdVar42[piVar18[lVar67 + -2]].i;
              dVar70 = -dVar30;
              dVar4 = *(double *)((long)pvVar20 + lVar62 + -0x10);
              dVar5 = *(double *)((long)pvVar20 + lVar62 + -8);
              dVar6 = *(double *)((long)pvVar20 + lVar62 + 8);
              dVar68 = dVar68 - (dVar4 * dVar7 + dVar5 * dVar70);
              dVar69 = dVar69 - (dVar4 * dVar30 + dVar5 * dVar7);
              lVar57 = (long)iVar45 * 0x10;
              dVar4 = *(double *)((long)pvVar20 + lVar57 + 8);
              dVar28 = dVar28 - (*(double *)((long)pvVar20 + lVar62) * dVar7 + dVar6 * dVar70 +
                                *(double *)((long)pvVar20 + lVar57) * dVar68 + dVar4 * -dVar69);
              dVar29 = dVar29 - (*(double *)((long)pvVar20 + lVar62) * dVar30 + dVar6 * dVar7 +
                                *(double *)((long)pvVar20 + lVar57) * dVar69 + dVar4 * dVar68);
              dVar23.i._0_4_ = SUB84(dVar29,0);
              dVar23.r = dVar28;
              dVar23.i._4_4_ = (int)((ulong)dVar29 >> 0x20);
              pdVar42[piVar18[lVar67]] = dVar23;
              pdVar42[iVar46].r = dVar68;
              pdVar42[iVar46].i = dVar69;
              iVar46 = piVar19[(long)iVar12 + 1];
              pdVar48 = (double *)((long)iVar44 * 0x10 + lVar2);
              pdVar50 = (double *)(lVar57 + lVar2);
              for (lVar57 = lVar38; lVar57 < iVar46; lVar57 = lVar57 + 1) {
                iVar14 = piVar18[lVar57];
                dVar4 = pdVar48[-1];
                dVar5 = *pdVar48;
                dVar6 = pdVar50[-1];
                dVar8 = *pdVar50;
                dVar9 = pdVar50[lVar66 * -2 + -1];
                dVar10 = pdVar50[lVar66 * -2];
                dVar31 = pdVar42[iVar14].i;
                pdVar42[iVar14].r =
                     pdVar42[iVar14].r -
                     (dVar9 * dVar7 + dVar10 * dVar70 +
                     dVar6 * dVar68 + dVar8 * -dVar69 + dVar4 * dVar28 + dVar5 * -dVar29);
                pdVar42[iVar14].i =
                     dVar31 - (dVar9 * dVar30 + dVar10 * dVar7 +
                              dVar6 * dVar69 + dVar8 * dVar68 + dVar4 * dVar29 + dVar5 * dVar28);
                pdVar48 = pdVar48 + 2;
                pdVar50 = pdVar50 + 2;
              }
            }
          }
          else {
            pdVar52 = local_138;
            for (uVar64 = 0; uVar64 <= uVar53; uVar64 = uVar64 + 1) {
              dVar28 = pdVar42[piVar18[(long)(iVar13 + (iVar46 - iVar12)) + uVar64]].i;
              pdVar52->r = pdVar42[piVar18[(long)(iVar13 + (iVar46 - iVar12)) + uVar64]].r;
              pdVar52->i = dVar28;
              pdVar52 = pdVar52 + 1;
            }
            zlsolve(ldm,iVar14,
                    (doublecomplex *)
                    ((long)(iVar44 + (iVar46 - iVar12) * iVar43) * 0x10 + (long)pvVar20),local_138);
          }
        }
        piVar51 = piVar51 + m;
        pdVar42 = pdVar42 + m;
        local_138 = local_138 + iVar36;
      }
      uVar53 = 0;
      while( true ) {
        if ((int)nrow <= (int)uVar53) break;
        uVar55 = uVar53 + iVar34;
        uVar54 = uVar55;
        if ((int)nrow < (int)uVar55) {
          uVar54 = nrow;
        }
        iVar37 = uVar54 - uVar53;
        if (iVar34 < (int)(uVar54 - uVar53)) {
          iVar37 = iVar34;
        }
        iVar43 = piVar21[iVar12];
        piVar51 = repfnz;
        pdVar42 = tempv;
        pdVar52 = dense;
        local_138 = tempv + iVar33;
        for (iVar65 = jcol; iVar65 < iVar63; iVar65 = iVar65 + 1) {
          iVar59 = piVar51[iVar11];
          if ((iVar59 != -1) && (2 < iVar11 - iVar59)) {
            zmatvec(ldm,iVar37,(iVar11 - iVar59) + 1,
                    (doublecomplex *)
                    ((long)(int)((iVar59 - iVar12) * ldm + uVar53 + iVar58 + iVar43) * 0x10 +
                    (long)pvVar20),pdVar42,pdVar42 + iVar33);
            pdVar41 = local_138;
            for (lVar66 = 0; lVar66 < iVar37; lVar66 = lVar66 + 1) {
              dVar28 = pdVar52[piVar18[iVar60 + lVar66]].i - pdVar41->i;
              dVar24.i._0_4_ = SUB84(dVar28,0);
              dVar24.r = pdVar52[piVar18[iVar60 + lVar66]].r - pdVar41->r;
              dVar24.i._4_4_ = (int)((ulong)dVar28 >> 0x20);
              pdVar52[piVar18[iVar60 + lVar66]] = dVar24;
              pdVar41->r = 0.0;
              pdVar41->i = 0.0;
              pdVar41 = pdVar41 + 1;
            }
          }
          piVar51 = piVar51 + m;
          pdVar52 = pdVar52 + m;
          pdVar42 = pdVar42 + iVar36;
          local_138 = local_138 + iVar36;
        }
        iVar60 = iVar60 + iVar34;
        uVar53 = uVar55;
      }
      pdVar42 = tempv;
      pdVar52 = dense;
      piVar51 = repfnz;
      for (iVar37 = jcol; iVar37 < iVar63; iVar37 = iVar37 + 1) {
        iVar60 = piVar51[iVar11];
        if ((iVar60 != -1) && (2 < iVar11 - iVar60)) {
          pdVar41 = pdVar42;
          for (uVar64 = 0; uVar64 <= (uint)(iVar11 - iVar60); uVar64 = uVar64 + 1) {
            iVar43 = piVar18[(long)(iVar60 + (iVar13 - iVar12)) + uVar64];
            dVar28 = pdVar41->i;
            pdVar52[iVar43].r = pdVar41->r;
            pdVar52[iVar43].i = dVar28;
            pdVar41->r = 0.0;
            pdVar41->i = 0.0;
            pdVar41 = pdVar41 + 1;
          }
        }
        piVar51 = piVar51 + m;
        pdVar52 = pdVar52 + m;
        pdVar42 = pdVar42 + iVar36;
      }
    }
  }
  return;
}

Assistant:

void
zpanel_bmod (
	    const int  m,          /* in - number of rows in the matrix */
	    const int  w,          /* in */
	    const int  jcol,       /* in */
	    const int  nseg,       /* in */
	    doublecomplex     *dense,     /* out, of size n by w */
	    doublecomplex     *tempv,     /* working array */
	    int        *segrep,    /* in */
	    int        *repfnz,    /* in, of size n by w */
	    GlobalLU_t *Glu,       /* modified */
	    SuperLUStat_t *stat    /* output */
	    )
{


#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int          incx = 1, incy = 1;
    doublecomplex       alpha, beta;
#endif

    register int k, ksub;
    int          fsupc, nsupc, nsupr, nrow;
    int          krep, krep_ind;
    doublecomplex       ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          segsze;
    int          block_nrow;  /* no of rows in a block row */
    int_t        lptr;	      /* Points to the row subscripts of a supernode */
    int          kfnz, irow, no_zeros; 
    register int isub, isub1, i;
    register int jj;	      /* Index through each column in the panel */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    doublecomplex       *lusup;
    int_t        *xlusup;
    int          *repfnz_col; /* repfnz[] for a column in the panel */
    doublecomplex       *dense_col;  /* dense[] for a column in the panel */
    doublecomplex       *tempv1;             /* Used in 1-D update */
    doublecomplex       *TriTmp, *MatvecTmp; /* used in 2-D update */
    doublecomplex      zero = {0.0, 0.0};
    doublecomplex      one = {1.0, 0.0};
    doublecomplex      comp_temp, comp_temp1;
    register int ldaTmp;
    register int r_ind, r_hi;
    int  maxsuper, rowblk, colblk;
    flops_t  *ops = stat->ops;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (doublecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    
    maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) );
    rowblk   = sp_ienv(4);
    colblk   = sp_ienv(5);
    ldaTmp   = maxsuper + rowblk;

    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) { /* for each updating supernode */

	/* krep = representative of current k-th supernode
	 * fsupc = first supernodal column
	 * nsupc = no of columns in a supernode
	 * nsupr = no of rows in a supernode
	 */
        krep = segrep[k--];
	fsupc = xsup[supno[krep]];
	nsupc = krep - fsupc + 1;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nrow = nsupr - nsupc;
	lptr = xlsub[fsupc];
	krep_ind = lptr + nsupc - 1;

	repfnz_col = repfnz;
	dense_col = dense;
	
	if ( nsupc >= colblk && nrow > rowblk ) { /* 2-D block update */

	    TriTmp = tempv;
	
	    /* Sequence through each column in panel -- triangular solves */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp ) {

		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
	    
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += 4 * segsze * (segsze - 1);
		ops[GEMV] += 8 * nrow * segsze;
	
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
	    	        zz_mult(&comp_temp, &ukj, &lusup[luptr]);
		        z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
		        zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		        z_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++;
			    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			    zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
  		        zz_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		        z_sub(&ukj1, &ukj1, &comp_temp);

		        zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
        		zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		        z_add(&comp_temp, &comp_temp, &comp_temp1);
		        z_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++; luptr2++;
			    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			    zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    }

		} else  {	/* segsze >= 4 */
		    
		    /* Copy U[*,j] segment from dense[*] to TriTmp[*], which
		       holds the result of triangular solves.    */
		    no_zeros = kfnz - fsupc;
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			TriTmp[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#else
		    ztrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#endif
#else		
		    zlsolve ( nsupr, segsze, &lusup[luptr], TriTmp );
#endif
		    

		} /* else ... */
	    
	    }  /* for jj ... end tri-solves */

	    /* Block row updates; push all the way into dense[*] block */
	    for ( r_ind = 0; r_ind < nrow; r_ind += rowblk ) {
		
		r_hi = SUPERLU_MIN(nrow, r_ind + rowblk);
		block_nrow = SUPERLU_MIN(rowblk, r_hi - r_ind);
		luptr = xlusup[fsupc] + nsupc + r_ind;
		isub1 = lptr + nsupc + r_ind;
		
		repfnz_col = repfnz;
		TriTmp = tempv;
		dense_col = dense;
		
		/* Sequence through each column in panel -- matrix-vector */
		for (jj = jcol; jj < jcol + w; jj++,
		     repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		    
		    kfnz = repfnz_col[krep];
		    if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		    
		    segsze = krep - kfnz + 1;
		    if ( segsze <= 3 ) continue;   /* skip unrolled cases */
		    
		    /* Perform a block update, and scatter the result of
		       matrix-vector to dense[].		 */
		    no_zeros = kfnz - fsupc;
		    luptr1 = luptr + nsupr * no_zeros;
		    MatvecTmp = &TriTmp[maxsuper];
		    
#ifdef USE_VENDOR_BLAS
		    alpha = one; 
                    beta = zero;
#ifdef _CRAY
		    CGEMV(ftcs2, &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#else
		    zgemv_("N", &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#endif
#else
		    zmatvec(nsupr, block_nrow, segsze, &lusup[luptr1],
			   TriTmp, MatvecTmp);
#endif
		    
		    /* Scatter MatvecTmp[*] into SPA dense[*] temporarily
		     * such that MatvecTmp[*] can be re-used for the
		     * the next blok row update. dense[] will be copied into 
		     * global store after the whole panel has been finished.
		     */
		    isub = isub1;
		    for (i = 0; i < block_nrow; i++) {
			irow = lsub[isub];
		        z_sub(&dense_col[irow], &dense_col[irow], 
                              &MatvecTmp[i]);
			MatvecTmp[i] = zero;
			++isub;
		    }
		    
		} /* for jj ... */
		
	    } /* for each block row ... */
	    
	    /* Scatter the triangular solves into SPA dense[*] */
	    repfnz_col = repfnz;
	    TriTmp = tempv;
	    dense_col = dense;
	    
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		if ( segsze <= 3 ) continue; /* skip unrolled cases */
		
		no_zeros = kfnz - fsupc;		
		isub = lptr + no_zeros;
		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub];
		    dense_col[irow] = TriTmp[i];
		    TriTmp[i] = zero;
		    ++isub;
		}
		
	    } /* for jj ... */
	    
	} else { /* 1-D block modification */
	    
	    
	    /* Sequence through each column in the panel */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m) {
		
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += 4 * segsze * (segsze - 1);
		ops[GEMV] += 8 * nrow * segsze;
		
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
	    	        zz_mult(&comp_temp, &ukj, &lusup[luptr]);
		        z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
		        zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		        z_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr;  ++luptr1;
			    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			    zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
  		        zz_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		        z_sub(&ukj1, &ukj1, &comp_temp);

		        zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
        		zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		        z_add(&comp_temp, &comp_temp, &comp_temp1);
		        z_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr; ++luptr1; ++luptr2;
			    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			    zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    }

		} else  { /* segsze >= 4 */
		    /* 
		     * Perform a triangular solve and block update,
		     * then scatter the result of sup-col update to dense[].
		     */
		    no_zeros = kfnz - fsupc;
		    
		    /* Copy U[*,j] segment from dense[*] to tempv[*]: 
		     *    The result of triangular solve is in tempv[*];
		     *    The result of matrix vector update is in dense_col[*]
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			tempv[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;
		    
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#else
		    ztrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#endif
		    
		    luptr += segsze;	/* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
                    alpha = one;
                    beta = zero;
#ifdef _CRAY
		    CGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		    zgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		    zlsolve ( nsupr, segsze, &lusup[luptr], tempv );
		    
		    luptr += segsze;        /* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
		    zmatvec (nsupr, nrow, segsze, &lusup[luptr], tempv, tempv1);
#endif
		    
		    /* Scatter tempv[*] into SPA dense[*] temporarily, such
		     * that tempv[*] can be used for the triangular solve of
		     * the next column of the panel. They will be copied into 
		     * ucol[*] after the whole panel has been finished.
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; i++) {
			irow = lsub[isub];
			dense_col[irow] = tempv[i];
			tempv[i] = zero;
			isub++;
		    }
		    
		    /* Scatter the update from tempv1[*] into SPA dense[*] */
		    /* Start dense rectangular L */
		    for (i = 0; i < nrow; i++) {
			irow = lsub[isub];
		        z_sub(&dense_col[irow], &dense_col[irow], &tempv1[i]);
			tempv1[i] = zero;
			++isub;	
		    }
		    
		} /* else segsze>=4 ... */
		
	    } /* for each column in the panel... */
	    
	} /* else 1-D update ... */

    } /* for each updating supernode ... */

}